

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTreeVisitor.cpp
# Opt level: O2

void __thiscall PrintTreeVisitor::Visit(PrintTreeVisitor *this,MainClass *main_class)

{
  ostream *poVar1;
  
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"Main class: ");
  poVar1 = std::operator<<(poVar1,(string *)&main_class->main_class_name_);
  std::endl<char,std::char_traits<char>>(poVar1);
  this->number_of_tabs_ = this->number_of_tabs_ + 1;
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"Main: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  this->number_of_tabs_ = this->number_of_tabs_ + 1;
  (**(main_class->main_->super_Statement).super_Node._vptr_Node)(main_class->main_,this);
  this->number_of_tabs_ = this->number_of_tabs_ + -1;
  (**(main_class->declarations_->super_Statement).super_Node._vptr_Node)
            (main_class->declarations_,this);
  this->number_of_tabs_ = this->number_of_tabs_ + -1;
  return;
}

Assistant:

void PrintTreeVisitor::Visit(MainClass* main_class) {
  PrintTabs();
  stream_ << "Main class: " << main_class->main_class_name_ << std::endl;

  ++number_of_tabs_;

  PrintTabs();
  stream_ << "Main: " << std::endl;

  ++number_of_tabs_;
  main_class->main_->Accept(this);
  --number_of_tabs_;

  --number_of_tabs_;

  ++number_of_tabs_;
  main_class->declarations_->Accept(this);
  --number_of_tabs_;
}